

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

size_t __thiscall google::protobuf::EnumValueOptions::ByteSizeLong(EnumValueOptions *this)

{
  size_t sVar1;
  Rep *pRVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  
  sVar1 = internal::ExtensionSet::ByteSize(&this->_extensions_);
  lVar5 = (long)(this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_;
  lVar4 = sVar1 + lVar5 * 2;
  pRVar2 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar2 != (Rep *)0x0) {
    pRVar2 = (Rep *)pRVar2->elements;
  }
  for (lVar3 = 0; lVar5 * 8 != lVar3; lVar3 = lVar3 + 8) {
    sVar1 = internal::WireFormatLite::MessageSize<google::protobuf::UninterpretedOption>
                      (*(UninterpretedOption **)((long)pRVar2->elements + lVar3 + -8));
    lVar4 = lVar4 + sVar1;
  }
  sVar1 = lVar4 + (ulong)((this->_has_bits_).has_bits_[0] & 1) * 2;
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) == 0) {
    (this->_cached_size_).size_.super___atomic_base<int>._M_i = (__int_type_conflict)sVar1;
    return sVar1;
  }
  sVar1 = internal::ComputeUnknownFieldsSize(&this->_internal_metadata_,sVar1,&this->_cached_size_);
  return sVar1;
}

Assistant:

size_t EnumValueOptions::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:google.protobuf.EnumValueOptions)
  size_t total_size = 0;

  total_size += _extensions_.ByteSize();

  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
  total_size += 2UL * this->_internal_uninterpreted_option_size();
  for (const auto& msg : this->uninterpreted_option_) {
    total_size +=
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(msg);
  }

  // optional bool deprecated = 1 [default = false];
  cached_has_bits = _has_bits_[0];
  if (cached_has_bits & 0x00000001u) {
    total_size += 1 + 1;
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    return ::PROTOBUF_NAMESPACE_ID::internal::ComputeUnknownFieldsSize(
        _internal_metadata_, total_size, &_cached_size_);
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}